

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::WebSocket,_std::nullptr_t> __thiscall
kj::anon_unknown_36::HttpClientAdapter::WebSocketResponseImpl::acceptWebSocket
          (WebSocketResponseImpl *this,HttpHeaders *headers)

{
  size_t *psVar1;
  Header *pHVar2;
  WebSocket WVar3;
  WebSocket *pWVar4;
  int in_ECX;
  __fn *in_RDX;
  WebSocket *extraout_RDX;
  WebSocket *extraout_RDX_00;
  WebSocket *pWVar5;
  void *in_R8;
  Own<kj::WebSocket,_std::nullptr_t> OVar6;
  WebSocket local_e0;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t> local_d8;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  Own<kj::WebSocket,_std::nullptr_t> wrapper;
  WebSocketPipe pipe;
  undefined1 local_80 [40];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_20;
  
  HttpHeaders::clone((HttpHeaders *)local_80,in_RDX,in_RDX,in_ECX,in_R8);
  heap<kj::HttpHeaders>((kj *)&headersCopy,(HttpHeaders *)local_80);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_80);
  newWebSocketPipe();
  psVar1 = &(headers->indexedHeaders).size_;
  *(int *)psVar1 = (int)*psVar1 + 1;
  local_d8.disposer = (Disposer *)&headers->indexedHeaders;
  local_d8.ptr = (WebSocketResponseImpl *)headers;
  Promise<void>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
            ((Promise<void> *)&local_e0,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)&(headers->unindexedHeaders).builder.pos);
  pWVar4 = (WebSocket *)operator_new(0x30);
  pWVar5 = pipe.ends[0].ptr;
  WVar3._vptr_WebSocket = local_e0._vptr_WebSocket;
  local_80._0_8_ = pipe.ends[0].disposer;
  pipe.ends[0].ptr = (WebSocket *)0x0;
  local_e0._vptr_WebSocket = (_func_int **)0x0;
  pWVar4->_vptr_WebSocket = (_func_int **)&PTR_send_0066fbd0;
  pWVar4[1]._vptr_WebSocket = (_func_int **)pipe.ends[0].disposer;
  pWVar4[2]._vptr_WebSocket = (_func_int **)pWVar5;
  local_80._8_8_ = (StringPtr *)0x0;
  *(undefined1 *)&pWVar4[3]._vptr_WebSocket = 1;
  local_20.ptr = (PromiseNode *)0x0;
  pWVar4[4]._vptr_WebSocket = WVar3._vptr_WebSocket;
  *(undefined2 *)&pWVar4[5]._vptr_WebSocket = 0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_20);
  Own<kj::WebSocket,_std::nullptr_t>::dispose((Own<kj::WebSocket,_std::nullptr_t> *)local_80);
  wrapper.disposer =
       (Disposer *)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket>::
        instance;
  wrapper.ptr = pWVar4;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_e0);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>::~Own
            (&local_d8);
  pHVar2 = (headers->unindexedHeaders).builder.ptr;
  local_80._0_4_ = 0x65;
  local_80._8_8_ = "Switching Protocols";
  local_80._16_8_ = 0x14;
  local_80._24_8_ = headersCopy.ptr;
  OVar6 = Own<kj::WebSocket,decltype(nullptr)>::attach<kj::Own<kj::HttpHeaders,decltype(nullptr)>>
                    ((Own<kj::WebSocket,decltype(nullptr)> *)&local_d8,
                     (Own<kj::HttpHeaders,_std::nullptr_t> *)&wrapper);
  local_80._32_4_ = 2;
  local_58 = local_d8.disposer._0_4_;
  uStack_54 = local_d8.disposer._4_4_;
  uStack_50 = local_d8.ptr._0_4_;
  uStack_4c = local_d8.ptr._4_4_;
  local_d8.ptr = (WebSocketResponseImpl *)0x0;
  (**(code **)((pHVar2->name).content.ptr + 0x10))(pHVar2,local_80,OVar6.ptr);
  OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>::
  ~OneOf((OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>
          *)(local_80 + 0x20));
  Own<kj::WebSocket,_std::nullptr_t>::dispose((Own<kj::WebSocket,_std::nullptr_t> *)&local_d8);
  (this->super_Response)._vptr_Response = (_func_int **)pipe.ends[1].disposer;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pipe.ends[1].ptr;
  pipe.ends[1].ptr = (WebSocket *)0x0;
  Own<kj::WebSocket,_std::nullptr_t>::dispose(&wrapper);
  WebSocketPipe::~WebSocketPipe(&pipe);
  pWVar5 = extraout_RDX;
  if (headersCopy.ptr != (HttpHeaders *)0x0) {
    headersCopy.ptr = (HttpHeaders *)0x0;
    (**(headersCopy.disposer)->_vptr_Disposer)();
    pWVar5 = extraout_RDX_00;
  }
  OVar6.ptr = pWVar5;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

kj::Own<WebSocket> acceptWebSocket(const HttpHeaders& headers) override {
      // The caller of HttpClient is allowed to assume that the headers remain valid until the body
      // stream is dropped, but the HttpService implementation is allowed to send headers that are
      // only valid until acceptWebSocket() returns, so we have to copy.
      auto headersCopy = kj::heap(headers.clone());

      auto pipe = newWebSocketPipe();

      // Wrap the client-side WebSocket in a wrapper that delays clean close of the WebSocket until
      // the service's request promise has finished.
      kj::Own<WebSocket> wrapper =
          kj::heap<DelayedCloseWebSocket>(kj::mv(pipe.ends[0]), task.attach(kj::addRef(*this)));
      fulfiller->fulfill({
        101, "Switching Protocols", headersCopy.get(),
        wrapper.attach(kj::mv(headersCopy))
      });
      return kj::mv(pipe.ends[1]);
    }